

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCliqueTable::extractCliquesFromCut(HighsMipSolver_const&,int_const*,double_const*,int,double)::__1,false>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               anon_class_8_1_8992ca70 comp,int bad_allowed,bool leftmost)

{
  int *piVar1;
  HighsInt *pHVar2;
  int iVar3;
  HighsInt HVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var5;
  bool bVar6;
  long lVar7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  ulong uVar9;
  ulong uVar10;
  HighsInt *pHVar11;
  int __tmp;
  HighsInt p2;
  ulong uVar12;
  long lVar13;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var14;
  HighsInt HVar15;
  int local_94;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:1213:36)>
  __cmp;
  anon_class_8_1_8992ca70 local_78;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_70;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_68;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_60;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_50;
  long local_48;
  ulong local_40;
  anon_class_8_1_8992ca70 comp_local;
  
  local_70._M_current = end._M_current + -1;
  local_50._M_current = end._M_current + -2;
  local_58._M_current = end._M_current + -3;
  _Var8._M_current = end._M_current;
  local_68._M_current = end._M_current;
  comp_local.vals = comp.vals;
  local_94 = bad_allowed;
LAB_0027ec66:
  do {
    lVar7 = (long)_Var8._M_current - (long)begin._M_current;
    uVar9 = lVar7 >> 2;
    if ((long)uVar9 < 0x18) {
      if ((leftmost & 1U) == 0) {
        if (begin._M_current != _Var8._M_current) {
          local_78.vals = comp.vals;
          while (pHVar11 = begin._M_current + 1, pHVar11 != _Var8._M_current) {
            HVar15 = *begin._M_current;
            HVar4 = begin._M_current[1];
            bVar6 = HighsCliqueTable::extractCliquesFromCut::anon_class_8_1_8992ca70::operator()
                              (&local_78,HVar4,HVar15);
            begin._M_current = pHVar11;
            if (bVar6) {
              do {
                *pHVar11 = HVar15;
                HVar15 = pHVar11[-2];
                pHVar11 = pHVar11 + -1;
                bVar6 = HighsCliqueTable::extractCliquesFromCut::anon_class_8_1_8992ca70::operator()
                                  (&local_78,HVar4,HVar15);
              } while (bVar6);
              *pHVar11 = HVar4;
              _Var8._M_current = local_68._M_current;
            }
          }
        }
      }
      else if (begin._M_current != _Var8._M_current) {
        lVar7 = 4;
        _Var8._M_current = begin._M_current;
        local_78.vals = comp.vals;
        while (_Var8._M_current + 1 != local_68._M_current) {
          HVar15 = *_Var8._M_current;
          HVar4 = _Var8._M_current[1];
          bVar6 = HighsCliqueTable::extractCliquesFromCut::anon_class_8_1_8992ca70::operator()
                            (&local_78,HVar4,HVar15);
          lVar13 = lVar7;
          if (bVar6) {
            do {
              *(HighsInt *)((long)begin._M_current + lVar13) = HVar15;
              _Var14._M_current = begin._M_current;
              if (lVar13 == 4) goto LAB_0027f172;
              HVar15 = *(HighsInt *)((long)begin._M_current + lVar13 + -8);
              bVar6 = HighsCliqueTable::extractCliquesFromCut::anon_class_8_1_8992ca70::operator()
                                (&local_78,HVar4,HVar15);
              lVar13 = lVar13 + -4;
            } while (bVar6);
            _Var14._M_current = (HighsInt *)(lVar13 + (long)begin._M_current);
LAB_0027f172:
            *_Var14._M_current = HVar4;
          }
          lVar7 = lVar7 + 4;
          _Var8._M_current = _Var8._M_current + 1;
        }
      }
      return;
    }
    uVar10 = uVar9 >> 1;
    _Var14._M_current = begin._M_current + uVar10;
    local_48 = lVar7;
    local_40 = uVar9;
    if (uVar9 < 0x81) {
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCliqueTable::extractCliquesFromCut(HighsMipSolver_const&,int_const*,double_const*,int,double)::__1>
                (_Var14,begin,local_70,comp);
    }
    else {
      local_60._M_current = _Var14._M_current;
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCliqueTable::extractCliquesFromCut(HighsMipSolver_const&,int_const*,double_const*,int,double)::__1>
                (begin,_Var14,local_70,comp);
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCliqueTable::extractCliquesFromCut(HighsMipSolver_const&,int_const*,double_const*,int,double)::__1>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (begin._M_current + 1),
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (begin._M_current + (uVar10 - 1)),local_50,comp);
      piVar1 = begin._M_current + uVar10;
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCliqueTable::extractCliquesFromCut(HighsMipSolver_const&,int_const*,double_const*,int,double)::__1>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (begin._M_current + 2),
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)(piVar1 + 1),
                 local_58,comp);
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCliqueTable::extractCliquesFromCut(HighsMipSolver_const&,int_const*,double_const*,int,double)::__1>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (begin._M_current + (uVar10 - 1)),local_60,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)(piVar1 + 1),
                 comp);
      iVar3 = *begin._M_current;
      *begin._M_current = *piVar1;
      *piVar1 = iVar3;
    }
    if (((leftmost & 1U) == 0) &&
       (bVar6 = HighsCliqueTable::extractCliquesFromCut::anon_class_8_1_8992ca70::operator()
                          (&comp_local,begin._M_current[-1],*begin._M_current), !bVar6)) {
      HVar4 = *begin._M_current;
      lVar7 = 0;
      local_78.vals = comp.vals;
      do {
        HVar15 = *(HighsInt *)((long)_Var8._M_current + lVar7 + -4);
        bVar6 = HighsCliqueTable::extractCliquesFromCut::anon_class_8_1_8992ca70::operator()
                          (&local_78,HVar4,HVar15);
        lVar7 = lVar7 + -4;
      } while (bVar6);
      pHVar11 = (HighsInt *)((long)_Var8._M_current + lVar7);
      _Var8._M_current = begin._M_current;
      p2 = HVar4;
      if (lVar7 == -4) {
        do {
          if (pHVar11 <= _Var8._M_current) break;
          p2 = _Var8._M_current[1];
          _Var8._M_current = _Var8._M_current + 1;
          bVar6 = HighsCliqueTable::extractCliquesFromCut::anon_class_8_1_8992ca70::operator()
                            (&local_78,HVar4,p2);
        } while (!bVar6);
      }
      else {
        do {
          p2 = _Var8._M_current[1];
          _Var8._M_current = _Var8._M_current + 1;
          bVar6 = HighsCliqueTable::extractCliquesFromCut::anon_class_8_1_8992ca70::operator()
                            (&local_78,HVar4,p2);
        } while (!bVar6);
      }
      while (_Var8._M_current < pHVar11) {
        *_Var8._M_current = HVar15;
        *pHVar11 = p2;
        do {
          HVar15 = pHVar11[-1];
          pHVar11 = pHVar11 + -1;
          bVar6 = HighsCliqueTable::extractCliquesFromCut::anon_class_8_1_8992ca70::operator()
                            (&local_78,HVar4,HVar15);
        } while (bVar6);
        do {
          p2 = _Var8._M_current[1];
          _Var8._M_current = _Var8._M_current + 1;
          bVar6 = HighsCliqueTable::extractCliquesFromCut::anon_class_8_1_8992ca70::operator()
                            (&local_78,HVar4,p2);
        } while (!bVar6);
      }
      *begin._M_current = HVar15;
      *pHVar11 = HVar4;
      _Var8._M_current = local_68._M_current;
      begin._M_current = pHVar11 + 1;
      goto LAB_0027ec66;
    }
    HVar4 = *begin._M_current;
    lVar7 = 0;
    local_78.vals = comp.vals;
    do {
      HVar15 = *(HighsInt *)((long)begin._M_current + lVar7 + 4);
      bVar6 = HighsCliqueTable::extractCliquesFromCut::anon_class_8_1_8992ca70::operator()
                        (&local_78,HVar15,HVar4);
      lVar7 = lVar7 + 4;
    } while (bVar6);
    _Var14._M_current = begin._M_current + lVar7;
    _Var5._M_current = _Var14._M_current;
    if (lVar7 == 4) {
      do {
        pHVar11 = _Var8._M_current;
        if (_Var8._M_current <= _Var14._M_current) break;
        pHVar11 = _Var8._M_current + -1;
        _Var8._M_current = _Var8._M_current + -1;
        bVar6 = HighsCliqueTable::extractCliquesFromCut::anon_class_8_1_8992ca70::operator()
                          (&local_78,*pHVar11,HVar4);
        pHVar11 = _Var8._M_current;
      } while (!bVar6);
    }
    else {
      do {
        pHVar11 = _Var8._M_current + -1;
        _Var8._M_current = _Var8._M_current + -1;
        bVar6 = HighsCliqueTable::extractCliquesFromCut::anon_class_8_1_8992ca70::operator()
                          (&local_78,*pHVar11,HVar4);
        pHVar11 = _Var8._M_current;
      } while (!bVar6);
    }
    while (local_60._M_current = _Var5._M_current, uVar9 = local_40,
          _Var5._M_current = local_68._M_current, _Var14._M_current < _Var8._M_current) {
      *_Var14._M_current = *_Var8._M_current;
      *_Var8._M_current = HVar15;
      do {
        HVar15 = _Var14._M_current[1];
        _Var14._M_current = _Var14._M_current + 1;
        bVar6 = HighsCliqueTable::extractCliquesFromCut::anon_class_8_1_8992ca70::operator()
                          (&local_78,HVar15,HVar4);
      } while (bVar6);
      do {
        pHVar2 = _Var8._M_current + -1;
        _Var8._M_current = _Var8._M_current + -1;
        bVar6 = HighsCliqueTable::extractCliquesFromCut::anon_class_8_1_8992ca70::operator()
                          (&local_78,*pHVar2,HVar4);
        _Var5._M_current = local_60._M_current;
      } while (!bVar6);
    }
    _Var8._M_current = _Var14._M_current + -1;
    *begin._M_current = _Var14._M_current[-1];
    _Var14._M_current[-1] = HVar4;
    uVar12 = (long)_Var8._M_current - (long)begin._M_current >> 2;
    uVar10 = (long)local_68._M_current - (long)_Var14._M_current >> 2;
    if (((long)uVar12 < (long)(local_40 >> 3)) || ((long)uVar10 < (long)(local_40 >> 3))) {
      local_94 = local_94 + -1;
      if (local_94 == 0) {
        uVar10 = local_40 - 2 >> 1;
        do {
          std::
          __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsCliqueTable::extractCliquesFromCut(HighsMipSolver_const&,int_const*,double_const*,int,double)::__1>>
                    (begin,uVar10,uVar9,begin._M_current[uVar10],
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:1213:36)>
                      )comp.vals);
          bVar6 = uVar10 != 0;
          uVar10 = uVar10 - 1;
          lVar7 = local_48;
        } while (bVar6);
        while (_Var8._M_current = local_70._M_current, 4 < lVar7) {
          iVar3 = *local_70._M_current;
          *local_70._M_current = *begin._M_current;
          std::
          __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsCliqueTable::extractCliquesFromCut(HighsMipSolver_const&,int_const*,double_const*,int,double)::__1>>
                    (begin,0,lVar7 + -4 >> 2,iVar3,
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:1213:36)>
                      )comp.vals);
          local_70._M_current = _Var8._M_current + -1;
          lVar7 = lVar7 + -4;
        }
        return;
      }
      if (0x17 < (long)uVar12) {
        iVar3 = *begin._M_current;
        uVar9 = uVar12 & 0xfffffffffffffffc;
        *begin._M_current = *(begin._M_current + uVar9);
        *(begin._M_current + uVar9) = iVar3;
        iVar3 = _Var14._M_current[-2];
        _Var14._M_current[-2] = *(_Var14._M_current + (-4 - uVar9));
        *(_Var14._M_current + (-4 - uVar9)) = iVar3;
        if (0x80 < uVar12) {
          uVar12 = uVar12 >> 2;
          iVar3 = begin._M_current[1];
          begin._M_current[1] = begin._M_current[uVar12 + 1];
          begin._M_current[uVar12 + 1] = iVar3;
          iVar3 = begin._M_current[2];
          begin._M_current[2] = begin._M_current[uVar12 + 2];
          begin._M_current[uVar12 + 2] = iVar3;
          iVar3 = _Var14._M_current[-3];
          _Var14._M_current[-3] = _Var14._M_current[~uVar12 - 1];
          _Var14._M_current[~uVar12 - 1] = iVar3;
          iVar3 = _Var14._M_current[-4];
          _Var14._M_current[-4] = _Var14._M_current[-uVar12 + -3];
          _Var14._M_current[-uVar12 + -3] = iVar3;
        }
      }
      if (0x17 < (long)uVar10) {
        uVar9 = uVar10 & 0xfffffffffffffffc;
        iVar3 = *_Var14._M_current;
        *_Var14._M_current = *(_Var14._M_current + uVar9);
        *(_Var14._M_current + uVar9) = iVar3;
        iVar3 = local_68._M_current[-1];
        local_68._M_current[-1] = *(local_68._M_current - uVar9);
        *(local_68._M_current - uVar9) = iVar3;
        if (0x80 < uVar10) {
          uVar10 = uVar10 >> 2;
          iVar3 = _Var14._M_current[1];
          _Var14._M_current[1] = _Var14._M_current[uVar10 + 1];
          _Var14._M_current[uVar10 + 1] = iVar3;
          iVar3 = _Var14._M_current[2];
          _Var14._M_current[2] = _Var14._M_current[uVar10 + 2];
          _Var14._M_current[uVar10 + 2] = iVar3;
          iVar3 = local_68._M_current[-2];
          local_68._M_current[-2] = local_68._M_current[~uVar10];
          local_68._M_current[~uVar10] = iVar3;
          iVar3 = local_68._M_current[-3];
          local_68._M_current[-3] = local_68._M_current[-2 - uVar10];
          local_68._M_current[-2 - uVar10] = iVar3;
        }
      }
    }
    else if (((pHVar11 <= local_60._M_current) &&
             (bVar6 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCliqueTable::extractCliquesFromCut(HighsMipSolver_const&,int_const*,double_const*,int,double)::__1>
                                (begin,_Var8,comp), bVar6)) &&
            (bVar6 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCliqueTable::extractCliquesFromCut(HighsMipSolver_const&,int_const*,double_const*,int,double)::__1>
                               (_Var14,_Var5,comp), bVar6)) {
      return;
    }
    pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCliqueTable::extractCliquesFromCut(HighsMipSolver_const&,int_const*,double_const*,int,double)::__1,false>
              (begin,_Var8,comp,local_94,(bool)(leftmost & 1));
    leftmost = false;
    _Var8._M_current = _Var5._M_current;
    begin._M_current = _Var14._M_current;
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }